

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O3

void ryg_dxt::CompressAlphaBlock(sU8 *dest,sU32 *src)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  sU8 *psVar12;
  sInt i;
  uint uVar13;
  
  uVar5 = (uint)*(byte *)((long)src + 3);
  lVar7 = 0;
  uVar11 = (uint)*(byte *)((long)src + 3);
  do {
    bVar2 = *(byte *)((long)src + lVar7 * 4 + 7);
    uVar13 = (uint)bVar2;
    if (bVar2 <= uVar5) {
      uVar5 = uVar13;
    }
    if (uVar13 < uVar11) {
      uVar13 = uVar11;
    }
    uVar11 = uVar13;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xf);
  *dest = (sU8)uVar11;
  dest[1] = (sU8)uVar5;
  psVar12 = dest + 2;
  iVar8 = uVar11 - uVar5;
  iVar1 = iVar8 * 4;
  iVar4 = iVar8 * 2;
  lVar7 = 0;
  uVar11 = 0;
  iVar6 = 0;
  do {
    iVar9 = (*(byte *)((long)src + lVar7 * 4 + 3) - uVar5) * 7 + (iVar8 >> 1);
    iVar10 = 0;
    if (iVar1 < iVar9) {
      iVar10 = iVar1;
    }
    iVar10 = iVar9 - iVar10;
    iVar3 = (uint)(iVar1 < iVar9) * 4 + 6;
    if (iVar10 <= iVar4) {
      iVar3 = (uint)(iVar1 < iVar9) * 4;
    }
    iVar9 = 0;
    if (iVar4 < iVar10) {
      iVar9 = iVar4;
    }
    uVar13 = ((iVar8 - iVar10) + iVar9 >> 0x1f) + iVar3 & 7;
    uVar11 = (uVar13 < 2 ^ uVar13) << ((byte)iVar6 & 0x1f) | uVar11;
    if (iVar6 < 5) {
      iVar6 = iVar6 + 3;
    }
    else {
      *psVar12 = (sU8)uVar11;
      psVar12 = psVar12 + 1;
      uVar11 = (int)uVar11 >> 8;
      iVar6 = iVar6 + -5;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10);
  return;
}

Assistant:

static void CompressAlphaBlock(sU8* dest, const sU32* src) {
  const Pixel* block = (const Pixel*)src;

  // find min/max color
  sInt min, max;
  min = max = block[0].a;

  for (sInt i = 1; i < 16; i++) {
    min = sMin<sInt>(min, block[i].a);
    max = sMax<sInt>(max, block[i].a);
  }

  // encode them
  *dest++ = max;
  *dest++ = min;

  // determine bias and emit color indices
  sInt dist = max - min;
  sInt bias = min * 7 - (dist >> 1);
  sInt dist4 = dist * 4;
  sInt dist2 = dist * 2;
  sInt bits = 0, mask = 0;

  for (sInt i = 0; i < 16; i++) {
    sInt a = block[i].a * 7 - bias;
    sInt ind, t;

    // select index (hooray for bit magic)
    t = (dist4 - a) >> 31;
    ind = t & 4;
    a -= dist4 & t;
    t = (dist2 - a) >> 31;
    ind += t & 2;
    a -= dist2 & t;
    t = (dist - a) >> 31;
    ind += t & 1;

    ind = -ind & 7;
    ind ^= (2 > ind);

    // write index
    mask |= ind << bits;
    if ((bits += 3) >= 8) {
      *dest++ = mask;
      mask >>= 8;
      bits -= 8;
    }
  }
}